

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# WebSocket.cpp
# Opt level: O1

WebSocketMsg * __thiscall asl::WebSocketMsg::fix(WebSocketMsg *this)

{
  ulong in_RAX;
  int m;
  undefined8 uStack_18;
  
  uStack_18 = in_RAX & 0xffffffffffffff;
  Array<unsigned_char>::insert(&this->_data,-1,(uchar *)((long)&uStack_18 + 7));
  m = *(int *)((this->_data)._a + -0x10) + -1;
  Array<unsigned_char>::reserve(&this->_data,m);
  *(int *)((this->_data)._a + -0x10) = m;
  return this;
}

Assistant:

WebSocketMsg& WebSocketMsg::fix()
{
	_data << byte(0);
	_data.resize(_data.length() - 1);
	return *this;
}